

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

void google::protobuf::compiler::cpp::ListAllTypesForServices
               (FileDescriptor *fd,
               vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *types)

{
  long lVar1;
  MethodDescriptor *this;
  int j;
  long lVar2;
  long lVar3;
  Descriptor *local_48;
  FileDescriptor *local_40;
  long local_38;
  
  local_40 = fd;
  for (local_38 = 0; local_38 < *(int *)(local_40 + 0x34); local_38 = local_38 + 1) {
    lVar1 = local_38 * 0x30 + *(long *)(local_40 + 0x68);
    lVar3 = 0;
    for (lVar2 = 0; lVar2 < *(int *)(lVar1 + 0x28); lVar2 = lVar2 + 1) {
      this = (MethodDescriptor *)(*(long *)(lVar1 + 0x20) + lVar3);
      local_48 = MethodDescriptor::input_type(this);
      std::
      vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
      ::emplace_back<google::protobuf::Descriptor_const*>
                ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                  *)types,&local_48);
      local_48 = MethodDescriptor::output_type(this);
      std::
      vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
      ::emplace_back<google::protobuf::Descriptor_const*>
                ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                  *)types,&local_48);
      lVar3 = lVar3 + 0x40;
    }
  }
  return;
}

Assistant:

void ListAllTypesForServices(const FileDescriptor* fd,
                             std::vector<const Descriptor*>* types) {
  for (int i = 0; i < fd->service_count(); i++) {
    const ServiceDescriptor* sd = fd->service(i);
    for (int j = 0; j < sd->method_count(); j++) {
      const MethodDescriptor* method = sd->method(j);
      types->push_back(method->input_type());
      types->push_back(method->output_type());
    }
  }
}